

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CTypeID cp_struct_name(CPState *cp,CPDecl *sdecl,CTInfo info)

{
  uint8_t *puVar1;
  GCstr *pGVar2;
  CTypeID id;
  CType *in_RAX;
  ErrMsg em;
  CType *ct;
  CType *local_28;
  
  cp->tmask = 0x2022;
  local_28 = in_RAX;
  cp_next(cp);
  cp_decl_attributes(cp,sdecl);
  cp->tmask = 0x38c0;
  if (cp->tok == 0x7b) {
    id = lj_ctype_new(cp->cts,&local_28);
    local_28->info = info;
    local_28->size = 0xffffffff;
LAB_0014ba99:
    if (cp->tok != 0x7b) {
      return id;
    }
    if ((local_28->size == 0xffffffff) && (local_28->sib == 0)) {
      local_28->sib = 1;
      return id;
    }
  }
  else {
    if (cp->tok != 0x100) {
      cp_err_token(cp,0x100);
    }
    id = (cp->val).id;
    if (id == 0) {
      if ((cp->mode & 0x10) != 0) {
        pGVar2 = cp->str;
        em = LJ_ERR_FFI_BADTAG;
        goto LAB_0014bad6;
      }
      id = lj_ctype_new(cp->cts,&local_28);
      local_28->info = info;
      local_28->size = 0xffffffff;
      pGVar2 = cp->str;
      puVar1 = &pGVar2->marked;
      *puVar1 = *puVar1 | 0x20;
      (local_28->name).gcptr64 = (uint64_t)pGVar2;
      lj_ctype_addname(cp->cts,local_28,id);
LAB_0014ba91:
      cp_next(cp);
      goto LAB_0014ba99;
    }
    local_28 = cp->ct;
    if (((info ^ local_28->info) & 0xf0800000) == 0) goto LAB_0014ba91;
  }
  pGVar2 = (GCstr *)(local_28->name).gcptr64;
  em = LJ_ERR_FFI_REDEF;
LAB_0014bad6:
  cp_errmsg(cp,0,em,pGVar2 + 1);
}

Assistant:

static CTypeID cp_struct_name(CPState *cp, CPDecl *sdecl, CTInfo info)
{
  CTypeID sid;
  CType *ct;
  cp->tmask = CPNS_STRUCT;
  cp_next(cp);
  cp_decl_attributes(cp, sdecl);
  cp->tmask = CPNS_DEFAULT;
  if (cp->tok != '{') {
    if (cp->tok != CTOK_IDENT) cp_err_token(cp, CTOK_IDENT);
    if (cp->val.id) {  /* Name of existing struct/union/enum. */
      sid = cp->val.id;
      ct = cp->ct;
      if ((ct->info ^ info) & (CTMASK_NUM|CTF_UNION))  /* Wrong type. */
	cp_errmsg(cp, 0, LJ_ERR_FFI_REDEF, strdata(gco2str(gcref(ct->name))));
    } else {  /* Create named, incomplete struct/union/enum. */
      if ((cp->mode & CPARSE_MODE_NOIMPLICIT))
	cp_errmsg(cp, 0, LJ_ERR_FFI_BADTAG, strdata(cp->str));
      sid = lj_ctype_new(cp->cts, &ct);
      ct->info = info;
      ct->size = CTSIZE_INVALID;
      ctype_setname(ct, cp->str);
      lj_ctype_addname(cp->cts, ct, sid);
    }
    cp_next(cp);
  } else {  /* Create anonymous, incomplete struct/union/enum. */
    sid = lj_ctype_new(cp->cts, &ct);
    ct->info = info;
    ct->size = CTSIZE_INVALID;
  }
  if (cp->tok == '{') {
    if (ct->size != CTSIZE_INVALID || ct->sib)
      cp_errmsg(cp, 0, LJ_ERR_FFI_REDEF, strdata(gco2str(gcref(ct->name))));
    ct->sib = 1;  /* Indicate the type is currently being defined. */
  }
  return sid;
}